

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeSelect<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *res_00;
  bool bVar1;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> _val;
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> res;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.
               super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
               .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x20);
  results<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
             __return_storage_ptr___00,ctx);
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::MaybeResult
            ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)local_78,
             (MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
             __return_storage_ptr___00);
  local_90 = MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::getErr
                       ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                        local_78);
  bVar1 = local_90 == (Err *)0x0;
  if (!bVar1) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::~MaybeResult
            ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)local_78);
  if (bVar1) {
    res_00 = MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::getPtr
                       ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                        ((long)&_val.val.
                                super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                .
                                super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                        + 0x20));
    ParseDefsCtx::makeSelect(__return_storage_ptr__,ctx,pos,annotations,res_00);
  }
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::~MaybeResult
            ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
             ((long)&_val.val.
                     super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x20))
  ;
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeSelect(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto res = results(ctx);
  CHECK_ERR(res);
  return ctx.makeSelect(pos, annotations, res.getPtr());
}